

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expression_heuristics.cpp
# Opt level: O1

idx_t duckdb::ExpressionHeuristics::ExpressionCost(BoundFunctionExpression *expr)

{
  unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *puVar1;
  type expr_00;
  idx_t iVar2;
  iterator iVar3;
  unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *child;
  unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *this;
  long lVar4;
  long lVar5;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
  function_costs;
  undefined1 local_30b;
  undefined1 local_30a;
  undefined1 local_309;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  local_308;
  undefined1 *local_2d0 [2];
  undefined1 local_2c0 [16];
  undefined8 local_2b0;
  undefined1 *local_2a8 [2];
  undefined1 local_298 [16];
  undefined8 local_288;
  undefined1 *local_280 [2];
  undefined1 local_270 [16];
  undefined8 local_260;
  undefined1 *local_258 [2];
  undefined1 local_248 [16];
  undefined8 local_238;
  undefined1 *local_230 [2];
  undefined1 local_220 [16];
  undefined8 local_210;
  undefined1 *local_208 [2];
  undefined1 local_1f8 [16];
  undefined8 local_1e8;
  undefined1 *local_1e0 [2];
  undefined1 local_1d0 [16];
  undefined8 local_1c0;
  undefined1 *local_1b8 [2];
  undefined1 local_1a8 [16];
  undefined8 local_198;
  undefined1 *local_190 [2];
  undefined1 local_180 [16];
  undefined8 local_170;
  undefined1 *local_168 [2];
  undefined1 local_158 [16];
  undefined8 local_148;
  undefined1 *local_140 [2];
  undefined1 local_130 [16];
  undefined8 local_120;
  undefined1 *local_118 [2];
  undefined1 local_108 [16];
  undefined8 local_f8;
  undefined1 *local_f0 [2];
  undefined1 local_e0 [16];
  undefined8 local_d0;
  undefined1 *local_c8 [2];
  undefined1 local_b8 [16];
  undefined8 local_a8;
  undefined1 *local_a0 [2];
  undefined1 local_90 [16];
  undefined8 local_80;
  undefined1 *local_78 [2];
  undefined1 local_68 [16];
  undefined8 local_58;
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  undefined8 local_30;
  
  local_2d0[0] = local_2c0;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)local_2d0,"+","");
  local_2b0 = 5;
  local_2a8[0] = local_298;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)local_2a8,"-","");
  local_288 = 5;
  local_280[0] = local_270;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)local_280,"&","");
  local_260 = 5;
  local_258[0] = local_248;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)local_258,"#","");
  local_238 = 5;
  local_230[0] = local_220;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)local_230,">>","");
  local_210 = 5;
  local_208[0] = local_1f8;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)local_208,"<<","");
  local_1e8 = 5;
  local_1e0[0] = local_1d0;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)local_1e0,"abs","");
  local_1c0 = 5;
  local_1b8[0] = local_1a8;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1b8,anon_var_dwarf_63b5a9f + 8,anon_var_dwarf_63b5a9f + 9);
  local_198 = 10;
  local_190[0] = local_180;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)local_190,"%","");
  local_170 = 10;
  local_168[0] = local_158;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)local_168,"/","");
  local_148 = 0xf;
  local_140[0] = local_130;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)local_140,"date_part","");
  local_120 = 0x14;
  local_118[0] = local_108;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)local_118,"year","");
  local_f8 = 0x14;
  local_f0[0] = local_e0;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)local_f0,"round","");
  local_d0 = 100;
  local_c8[0] = local_b8;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)local_c8,"~~","");
  local_a8 = 200;
  local_a0[0] = local_90;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)local_a0,"!~~","");
  local_80 = 200;
  local_78[0] = local_68;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)local_78,"regexp_matches","");
  local_58 = 200;
  local_50[0] = local_40;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)local_50,"||","");
  local_30 = 200;
  ::std::
  _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,unsigned_long>,std::allocator<std::pair<std::__cxx11::string_const,unsigned_long>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
  ::_Hashtable<std::pair<std::__cxx11::string_const,unsigned_long>const*>
            ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,unsigned_long>,std::allocator<std::pair<std::__cxx11::string_const,unsigned_long>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
              *)&local_308,local_2d0,&stack0xffffffffffffffd8,0,&local_309,&local_30a,&local_30b);
  lVar5 = 0;
  do {
    if (local_40 + lVar5 != *(undefined1 **)((long)local_50 + lVar5)) {
      operator_delete(*(undefined1 **)((long)local_50 + lVar5));
    }
    lVar5 = lVar5 + -0x28;
  } while (lVar5 != -0x2a8);
  puVar1 = (expr->children).
           super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
           .
           super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  lVar5 = 0;
  for (this = (expr->children).
              super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
              .
              super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
              ._M_impl.super__Vector_impl_data._M_start; this != puVar1; this = this + 1) {
    expr_00 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
              operator*(this);
    iVar2 = Cost(expr_00);
    lVar5 = lVar5 + iVar2;
  }
  iVar3 = ::std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::find(&local_308,
                 &(expr->function).super_BaseScalarFunction.super_SimpleFunction.super_Function.name
                );
  if (iVar3.
      super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_true>
      ._M_cur == (__node_type *)0x0) {
    lVar4 = 1000;
  }
  else {
    lVar4 = *(long *)((long)iVar3.
                            super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_true>
                            ._M_cur + 0x28);
  }
  ::std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(&local_308);
  return lVar4 + lVar5;
}

Assistant:

idx_t ExpressionHeuristics::ExpressionCost(BoundFunctionExpression &expr) {
	unordered_map<std::string, idx_t> function_costs = {
	    {"+", 5},       {"-", 5},    {"&", 5},          {"#", 5},
	    {">>", 5},      {"<<", 5},   {"abs", 5},        {"*", 10},
	    {"%", 10},      {"/", 15},   {"date_part", 20}, {"year", 20},
	    {"round", 100}, {"~~", 200}, {"!~~", 200},      {"regexp_matches", 200},
	    {"||", 200}};

	idx_t cost_children = 0;
	for (auto &child : expr.children) {
		cost_children += Cost(*child);
	}

	auto cost_function = function_costs.find(expr.function.name);
	if (cost_function != function_costs.end()) {
		return cost_children + cost_function->second;
	} else {
		return cost_children + 1000;
	}
}